

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int Js(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  UserData in_RCX;
  SUNMatrix in_RDX;
  UserData udata;
  
  SUNMatZero(in_RDX);
  LaplaceMatrix(1.0,in_RDX,in_RCX);
  AdvectionJac(1.0,in_RDX,in_RCX);
  return 0;
}

Assistant:

static int Js(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data         */
  SUNMatZero(J);                        /* Initialize Jacobian to zero */

  /* Fill in the Laplace matrix */
  LaplaceMatrix(SUN_RCONST(1.0), J, udata);

  /* Add Jacobian of the advection terms  */
  AdvectionJac(SUN_RCONST(1.0), J, udata);

  /* Return with success */
  return 0;
}